

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O0

void __thiscall GmmLib::GmmXe_LPGCachePolicy::SetUpMOCSTable(GmmXe_LPGCachePolicy *this)

{
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar1;
  int local_1c;
  int index;
  GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement;
  GmmXe_LPGCachePolicy *this_local;
  
  pGVar1 = Context::GetCachePolicyTlbElement
                     ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                      super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                      super_GmmCachePolicyCommon.pGmmLibContext);
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0;
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xffbf;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xff7f | 0x80;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfffffff3 | 0xc;
    pGVar1[local_1c].LeCC.DwordValue = pGVar1[local_1c].LeCC.DwordValue & 0xfffffeff;
  }
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffcf | 0x30;
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffbf;
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xff7f | 0x80;
  (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffffff3;
  (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffffeff | 0x100;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffbf;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xff7f | 0x80;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffff3;
  pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffbf;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xff7f | 0x80;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffff3;
  pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffbf;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xff7f | 0x80;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffff3 | 0xc;
  pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffbf | 0x40;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xff7f | 0x80;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffff3;
  pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffbf | 0x40;
  pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xff7f | 0x80;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffff3 | 0xc;
  pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xffbf;
  pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xff7f;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffffff3;
  pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xffbf;
  pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xff7f;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffffff3 | 0xc;
  pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xffbf | 0x40;
  pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xff7f;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffffff3;
  pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[9].L3.UshortValue = pGVar1[9].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[9].L3.UshortValue = pGVar1[9].L3.UshortValue & 0xffbf | 0x40;
  pGVar1[9].L3.UshortValue = pGVar1[9].L3.UshortValue & 0xff7f;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfffffff3 | 0xc;
  pGVar1[9].LeCC.DwordValue = pGVar1[9].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[0xe].L3.UshortValue = pGVar1[0xe].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[0xe].L3.UshortValue = pGVar1[0xe].L3.UshortValue & 0xffbf;
  pGVar1[0xe].L3.UshortValue = pGVar1[0xe].L3.UshortValue & 0xff7f | 0x80;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfffffff3 | 4;
  pGVar1[0xe].LeCC.DwordValue = pGVar1[0xe].LeCC.DwordValue & 0xfffffeff | 0x100;
  pGVar1[0xf].L3.UshortValue = pGVar1[0xf].L3.UshortValue & 0xffcf | 0x10;
  pGVar1[0xf].L3.UshortValue = pGVar1[0xf].L3.UshortValue & 0xffbf | 0x40;
  pGVar1[0xf].L3.UshortValue = pGVar1[0xf].L3.UshortValue & 0xff7f;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfffffff3;
  pGVar1[0xf].LeCC.DwordValue = pGVar1[0xf].LeCC.DwordValue & 0xfffffeff | 0x100;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 0xf;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0;
  return;
}

Assistant:

void GmmLib::GmmXe_LPGCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);
    CurrentMaxL1HdcMocsIndex                             = 0;
    CurrentMaxSpecialMocsIndex                           = 0;

#define L3_UC (0x1)
#define L3_WB (0x3)

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define GMM_DEFINE_MOCS(Index, L3_LookUp, L3_Go, L3_CC, L4Caching, ignorePAT)      \
    {                                                                              \
        pCachePolicyTlbElement[Index].L3.Cacheability      = L3_CC;                \
        pCachePolicyTlbElement[Index].L3.GlobalGo          = L3_Go;                \
        pCachePolicyTlbElement[Index].L3.UCLookup          = L3_LookUp;            \
        pCachePolicyTlbElement[Index].LeCC.Xe_LPG.L4CC     = L4Caching;            \
        pCachePolicyTlbElement[Index].LeCC.Xe_LPG.igPAT    = ignorePAT;            \
    }
    // clang-format off

    //Default MOCS Table
    for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
    {     //             Index    LookUp  Go      L3CC        L4CC   ignorePAT
        GMM_DEFINE_MOCS( index  , 1     , 0     , L3_UC     , L4_UC     , 0)
    }
    // Fixed MOCS Table
    //             Index      LookUp  Go      L3CC       L4CC   ignorePAT
    GMM_DEFINE_MOCS( 0      , 1     , 0     , L3_WB    , L4_WB , 1)
    GMM_DEFINE_MOCS( 1      , 1     , 0     , L3_WB    , L4_WB , 1)
    GMM_DEFINE_MOCS( 2      , 1     , 0     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 3      , 1     , 0     , L3_UC    , L4_UC , 1)
    GMM_DEFINE_MOCS( 4      , 1     , 1     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 5      , 1     , 1     , L3_UC    , L4_UC , 1)
    GMM_DEFINE_MOCS( 6      , 0     , 0     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 7      , 0     , 0     , L3_UC    , L4_UC , 1)
    GMM_DEFINE_MOCS( 8      , 0     , 1     , L3_UC    , L4_WB , 1)
    GMM_DEFINE_MOCS( 9      , 0     , 1     , L3_UC    , L4_UC , 1)
    //Reserved 10-13
    GMM_DEFINE_MOCS( 14     , 1     , 0     , L3_WB    , L4_WT , 1) /* Note Update GMM_CC_DISP_MOCS_INDEX*/
    GMM_DEFINE_MOCS( 15     , 0     , 1     , L3_UC    , L4_WB , 1) /* Note Update GMM_NON_CC_DISP_MOCS_INDEX */

    CurrentMaxMocsIndex         = 15;
    CurrentMaxL1HdcMocsIndex    = 0;
    CurrentMaxSpecialMocsIndex  = 0;

// clang-format on
#undef GMM_DEFINE_MOCS
#undef L4_WB
#undef L4_WT
#undef L4_UC
#undef L3_UC
#undef L3_WB
}